

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FILongDecoder::decode(FILongDecoder *this,uint8_t *data,size_t len)

{
  ulong uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar3;
  shared_ptr<Assimp::FILongValue> sVar4;
  shared_ptr<const_Assimp::FIValue> sVar5;
  vector<long,_std::allocator<long>_> value;
  int64_t v;
  vector<long,_std::allocator<long>_> local_68;
  FIValue local_48;
  FILongDecoder FStack_40;
  
  if ((in_RCX & 7) == 0) {
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    std::vector<long,_std::allocator<long>_>::reserve(&local_68,in_RCX >> 3);
    if (in_RCX != 0) {
      uVar3 = 0;
      do {
        uVar1 = *(ulong *)(len + uVar3 * 8);
        local_48._vptr_FIValue =
             (_func_int **)
             (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
        if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)&local_48);
        }
        else {
          *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = (long)local_48._vptr_FIValue;
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
      } while (in_RCX >> 3 != uVar3);
    }
    sVar4 = FILongValue::create((FILongValue *)&local_48,&local_68);
    _Var2 = sVar4.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    *this = (FILongDecoder)local_48._vptr_FIValue;
    this[1] = FStack_40;
    if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var2._M_pi = extraout_RDX;
    }
    sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int64_t> value;
        size_t numLongs = len / 8;
        value.reserve(numLongs);
        for (size_t i = 0; i < numLongs; ++i) {
            int64_t b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            int64_t v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            value.push_back(v);
            data += 8;
        }
        return FILongValue::create(std::move(value));
    }